

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O3

bool __thiscall cmParseMumpsCoverage::ReadCoverageFile(cmParseMumpsCoverage *this,char *file)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  string path;
  string packages;
  string line;
  string type;
  ostringstream cmCTestLog_msg;
  ifstream in;
  undefined1 auStack_458 [4];
  uint local_454;
  string local_450;
  undefined1 *local_430;
  undefined8 local_428;
  undefined1 local_420;
  undefined7 uStack_41f;
  string local_410;
  long *local_3f0;
  long local_3e8;
  long local_3e0 [2];
  long *local_3d0;
  long local_3c0 [2];
  long local_3b0 [14];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream(local_238,file,_S_in);
  uVar3 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar3 & 5) == 0) {
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    local_410._M_string_length = 0;
    local_410.field_2._M_local_buf[0] = '\0';
    local_454 = uVar3;
    while (bVar1 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,&local_410,(bool *)0x0,0xffffffffffffffff), bVar1
          ) {
      lVar4 = std::__cxx11::string::find((char)&local_410,0x3a);
      local_430 = &local_420;
      local_428 = 0;
      local_420 = 0;
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&local_3f0,(ulong)&local_410);
        std::__cxx11::string::substr((ulong)&local_450,(ulong)&local_410);
        iVar2 = std::__cxx11::string::compare((char *)&local_3f0);
        if (iVar2 == 0) {
          LoadPackages(this,&local_450);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_3f0);
          if (iVar2 == 0) {
            (*this->_vptr_cmParseMumpsCoverage[2])(this,&local_450);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,"Parse Error in Mumps coverage file :\n",0x25);
            if (file == (char *)0x0) {
              std::ios::clear((int)auStack_458 + (int)*(undefined8 *)(local_3b0[0] + -0x18) + 0xa8);
            }
            else {
              sVar5 = strlen(file);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,file,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"\ntype: [",8);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_3b0,(char *)local_3f0,local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\npath:[",8);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_450._M_dataplus._M_p,local_450._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\ninput line: [",0xf);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_410._M_dataplus._M_p,local_410._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
            this_00 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(this_00,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseMumpsCoverage.cxx"
                         ,0x33,(char *)local_3d0,false);
            if (local_3d0 != local_3c0) {
              operator_delete(local_3d0,local_3c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
            std::ios_base::~ios_base(local_340);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        if (local_3f0 != local_3e0) {
          operator_delete(local_3f0,local_3e0[0] + 1);
        }
        if (local_430 != &local_420) {
          operator_delete(local_430,CONCAT71(uStack_41f,local_420) + 1);
        }
      }
    }
    uVar3 = local_454;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,
                      CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                               local_410.field_2._M_local_buf[0]) + 1);
      uVar3 = local_454;
    }
  }
  std::ifstream::~ifstream(local_238);
  return (uVar3 & 5) == 0;
}

Assistant:

bool cmParseMumpsCoverage::ReadCoverageFile(const char* file)
{
  // Read the gtm_coverage.mcov file, that has two lines of data:
  // packages:/full/path/to/Vista/Packages
  // coverage_dir:/full/path/to/dir/with/*.mcov
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  std::string line;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    std::string::size_type pos = line.find(':', 0);
    std::string packages;
    if (pos != std::string::npos) {
      std::string type = line.substr(0, pos);
      std::string path = line.substr(pos + 1);
      if (type == "packages") {
        this->LoadPackages(path);
      } else if (type == "coverage_dir") {
        this->LoadCoverageData(path);
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Parse Error in Mumps coverage file :\n"
                     << file << "\ntype: [" << type << "]\npath:[" << path
                     << "]\n"
                        "input line: ["
                     << line << "]\n");
      }
    }
  }
  return true;
}